

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.h
# Opt level: O0

void __thiscall
OrderMoney::OrderMoney<>
          (OrderMoney *this,shared_ptr<const_Money> *a,shared_ptr<const_Money> *b,
          shared_ptr<const_Money> *c)

{
  shared_ptr<OrderMoney> local_48;
  shared_ptr<const_Money> local_38;
  shared_ptr<const_Money> *local_28;
  shared_ptr<const_Money> *c_local;
  shared_ptr<const_Money> *b_local;
  shared_ptr<const_Money> *a_local;
  OrderMoney *this_local;
  
  local_28 = c;
  c_local = b;
  b_local = a;
  a_local = (shared_ptr<const_Money> *)this;
  std::make_shared<OrderMoney,std::shared_ptr<Money_const>const&,std::shared_ptr<Money_const>const&>
            ((shared_ptr<const_Money> *)&local_48,a);
  std::shared_ptr<Money_const>::shared_ptr<OrderMoney,void>
            ((shared_ptr<Money_const> *)&local_38,&local_48);
  OrderMoney(this,&local_38,local_28);
  std::shared_ptr<const_Money>::~shared_ptr(&local_38);
  std::shared_ptr<OrderMoney>::~shared_ptr(&local_48);
  return;
}

Assistant:

OrderMoney(
		const std::shared_ptr<const Money> &a,
		const std::shared_ptr<const Money> &b,
		const std::shared_ptr<const Money> &c,
		const T & ...d
	) : OrderMoney(std::make_shared<OrderMoney>(a, b), c, d...)
	{
	}